

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

ImGuiID ImGui::DockSpaceOverViewport
                  (ImGuiViewport *viewport,ImGuiDockNodeFlags dockspace_flags,
                  ImGuiWindowClass *window_class)

{
  ImGuiID id;
  ImVec2 local_7c;
  ImGuiID local_74;
  ImGuiID dockspace_id;
  char local_68 [8];
  char label [32];
  ImGuiWindowFlags local_3c;
  ImVec2 IStack_38;
  ImGuiWindowFlags host_window_flags;
  ImVec2 local_30;
  ImVec2 local_28;
  ImGuiWindowClass *local_20;
  ImGuiWindowClass *window_class_local;
  ImGuiViewport *pIStack_10;
  ImGuiDockNodeFlags dockspace_flags_local;
  ImGuiViewport *viewport_local;
  
  local_20 = window_class;
  window_class_local._4_4_ = dockspace_flags;
  pIStack_10 = viewport;
  if (viewport == (ImGuiViewport *)0x0) {
    pIStack_10 = GetMainViewport();
  }
  local_28 = ImGuiViewport::GetWorkPos(pIStack_10);
  ImVec2::ImVec2(&local_30,0.0,0.0);
  SetNextWindowPos(&local_28,0,&local_30);
  IStack_38 = ImGuiViewport::GetWorkSize(pIStack_10);
  SetNextWindowSize(&stack0xffffffffffffffc8,0);
  SetNextWindowViewport(pIStack_10->ID);
  local_3c = 0x282027;
  if ((window_class_local._4_4_ & 8) != 0) {
    local_3c = 0x2820a7;
  }
  ImFormatString(local_68,0x20,"DockSpaceViewport_%08X",(ulong)pIStack_10->ID);
  PushStyleVar(2,0.0);
  PushStyleVar(3,0.0);
  ImVec2::ImVec2((ImVec2 *)&stack0xffffffffffffff90,0.0,0.0);
  PushStyleVar(1,(ImVec2 *)&stack0xffffffffffffff90);
  Begin(local_68,(bool *)0x0,local_3c);
  PopStyleVar(3);
  id = GetID("DockSpace");
  local_74 = id;
  ImVec2::ImVec2(&local_7c,0.0,0.0);
  DockSpace(id,&local_7c,window_class_local._4_4_,local_20);
  End();
  return local_74;
}

Assistant:

ImGuiID ImGui::DockSpaceOverViewport(ImGuiViewport* viewport, ImGuiDockNodeFlags dockspace_flags, const ImGuiWindowClass* window_class)
{
    if (viewport == NULL)
        viewport = GetMainViewport();

    SetNextWindowPos(viewport->GetWorkPos());
    SetNextWindowSize(viewport->GetWorkSize());
    SetNextWindowViewport(viewport->ID);

    ImGuiWindowFlags host_window_flags = 0;
    host_window_flags |= ImGuiWindowFlags_NoTitleBar | ImGuiWindowFlags_NoCollapse | ImGuiWindowFlags_NoResize | ImGuiWindowFlags_NoMove | ImGuiWindowFlags_NoDocking;
    host_window_flags |= ImGuiWindowFlags_NoBringToFrontOnFocus | ImGuiWindowFlags_NoNavFocus;
    if (dockspace_flags & ImGuiDockNodeFlags_PassthruCentralNode)
        host_window_flags |= ImGuiWindowFlags_NoBackground;

    char label[32];
    ImFormatString(label, IM_ARRAYSIZE(label), "DockSpaceViewport_%08X", viewport->ID);

    PushStyleVar(ImGuiStyleVar_WindowRounding, 0.0f);
    PushStyleVar(ImGuiStyleVar_WindowBorderSize, 0.0f);
    PushStyleVar(ImGuiStyleVar_WindowPadding, ImVec2(0.0f, 0.0f));
    Begin(label, NULL, host_window_flags);
    PopStyleVar(3);

    ImGuiID dockspace_id = GetID("DockSpace");
    DockSpace(dockspace_id, ImVec2(0.0f, 0.0f), dockspace_flags, window_class);
    End();

    return dockspace_id;
}